

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyPoint2Point.cpp
# Opt level: O3

int __thiscall btMultiBodyPoint2Point::getIslandIdB(btMultiBodyPoint2Point *this)

{
  btMultiBody *pbVar1;
  long lVar2;
  long lVar3;
  btRigidBody *pbVar4;
  
  pbVar4 = this->m_rigidBodyB;
  if (pbVar4 == (btRigidBody *)0x0) {
    pbVar1 = (this->super_btMultiBodyConstraint).m_bodyB;
    if (pbVar1 == (btMultiBody *)0x0) {
      return -1;
    }
    pbVar4 = (btRigidBody *)pbVar1->m_baseCollider;
    if (pbVar4 == (btRigidBody *)0x0) {
      lVar2 = (long)(pbVar1->m_links).m_size;
      if (lVar2 < 1) {
        return -1;
      }
      lVar3 = 0;
      while (pbVar4 = *(btRigidBody **)
                       ((long)((pbVar1->m_links).m_data)->m_jointTorque + lVar3 + 0x1c),
            pbVar4 == (btRigidBody *)0x0) {
        lVar3 = lVar3 + 600;
        if (lVar2 * 600 - lVar3 == 0) {
          return -1;
        }
      }
    }
  }
  return (pbVar4->super_btCollisionObject).m_islandTag1;
}

Assistant:

int btMultiBodyPoint2Point::getIslandIdB() const
{
	if (m_rigidBodyB)
		return m_rigidBodyB->getIslandTag();
	if (m_bodyB)
	{
		btMultiBodyLinkCollider* col = m_bodyB->getBaseCollider();
		if (col)
			return col->getIslandTag();

		for (int i=0;i<m_bodyB->getNumLinks();i++)
		{
			col = m_bodyB->getLink(i).m_collider;
			if (col)
				return col->getIslandTag();
		}
	}
	return -1;
}